

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String __thiscall Bstrlib::String::operator+(String *this,uint c)

{
  uint in_EDX;
  uchar *extraout_RDX;
  undefined4 in_register_00000034;
  String SVar1;
  
  String(this,(String *)CONCAT44(in_register_00000034,c));
  operator+=(this,in_EDX);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = this;
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String String::operator+(const unsigned int c) const
    {
        String retval(*this);
        retval += c;
        return retval;
    }